

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_listener.cpp
# Opt level: O2

void __thiscall
chatter::PacketLoggerConsole::on_recv
          (PacketLoggerConsole *this,uint64_t ts,PacketStats *packet_stats,PeerStats *peer_stats)

{
  ostream *poVar1;
  char *this_00;
  string local_40;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  this_00 = " RECV<<<  ";
  poVar1 = std::operator<<(poVar1," RECV<<<  ");
  PacketListener::debug_string_abi_cxx11_
            (&local_40,(PacketListener *)this_00,packet_stats,peer_stats);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void PacketLoggerConsole::on_recv(uint64_t ts, const PacketStats& packet_stats, const PeerStats& peer_stats)
{
    std::cout << ts << " RECV<<<  " << debug_string(packet_stats, peer_stats) << std::endl;
}